

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool math::wide_integer::
     miller_rabin<math::wide_integer::uniform_int_distribution<2048u,unsigned_int,std::allocator<unsigned_int>,false>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
               (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *n,
               unsigned_fast_type number_of_trials,
               uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
               *distribution,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *generator)

{
  uint *puVar1;
  size_type sVar2;
  unsigned_fast_type uVar3;
  param_type *ppVar4;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar5;
  pointer pvVar6;
  unsigned_fast_type uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  param_type *v;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *in_R8;
  ulong uVar14;
  bool bVar15;
  local_wide_integer_type y;
  local_double_width_type np_dbl;
  local_wide_integer_type q;
  local_wide_integer_type np;
  local_double_width_type yd;
  local_wide_integer_type nm1;
  local_param_type params;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
  local_1b8;
  result_type local_1a0;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
  local_188;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_170;
  undefined **local_158;
  uint local_150;
  void *local_148;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<2048U,_unsigned_int,_allocator<unsigned_int>,_false>_>
  local_140;
  unsigned_fast_type local_128;
  uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *local_120;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_118;
  ulong local_110;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_108;
  param_type local_f0 [4];
  
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (&local_170,
             (dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)n);
  local_170._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00211c38;
  uVar13 = *local_170.elems;
  if ((uVar13 & 1) == 0) {
    if (uVar13 == 2) {
      local_f0[0].param_a.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array =
           (_func_int **)
           CONCAT44(local_f0[0].param_a.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    ._vptr_dynamic_array._4_4_,2);
      eVar5 = operator==((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                         &local_170,(uint *)local_f0);
      uVar13 = (uint)eVar5;
    }
    else {
LAB_001bbb59:
      uVar13 = 0;
    }
LAB_001bbb5b:
    bVar15 = false;
  }
  else {
    if (uVar13 < 0xe4) {
      v = local_f0;
      local_f0[0].param_a.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array =
           (_func_int **)
           CONCAT44(local_f0[0].param_a.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    ._vptr_dynamic_array._4_4_,0xe3);
      eVar5 = operator<=((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                         &local_170,(uint *)v);
      if (eVar5) {
        if (uVar13 == 1) {
          local_f0[0].param_a.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          _vptr_dynamic_array =
               (_func_int **)
               CONCAT44(local_f0[0].param_a.values.
                        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        ._vptr_dynamic_array._4_4_,1);
          eVar5 = operator==((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
                             )&local_170,(uint *)local_f0);
          if (eVar5) {
            bVar15 = false;
            uVar13 = 0;
            goto LAB_001bbb5d;
          }
        }
        memcpy(v,&DAT_001def70,0xc0);
        uVar11 = 0x30;
        do {
          uVar9 = uVar11 >> 1;
          uVar11 = ~uVar9 + uVar11;
          puVar1 = (uint *)((long)&(v->param_a).values.
                                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                   ._vptr_dynamic_array + uVar9 * 4);
          ppVar4 = (param_type *)(puVar1 + 1);
          if (uVar13 <= *puVar1) {
            uVar11 = uVar9;
            ppVar4 = v;
          }
          v = ppVar4;
        } while (0 < (long)uVar11);
        if (v == (param_type *)&stack0xffffffffffffffd0) goto LAB_001bbb59;
        uVar13 = (uint)(*(uint *)&(v->param_a).values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  ._vptr_dynamic_array <= uVar13);
        goto LAB_001bbb5b;
      }
    }
    bVar15 = true;
  }
LAB_001bbb5d:
  bVar12 = (byte)uVar13;
  if (bVar15) {
    uVar11 = 0xe221f97c30e94e1d;
    local_140.values.
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array = (_func_int **)0xe221f97c30e94e1d;
    operator%(&local_f0[0].param_a,
              (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_170,
              (unsigned_long *)&local_140);
    uVar9 = (ulong)local_f0[0].param_a.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    if (uVar9 == 0) {
      uVar14 = 0;
    }
    else {
      bVar8 = 0;
      lVar10 = 0;
      uVar14 = 0;
      do {
        in_R8 = (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                ((ulong)local_f0[0].param_a.values.
                        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        .elems[lVar10] << (bVar8 & 0x3f));
        uVar14 = uVar14 | (ulong)in_R8;
        lVar10 = lVar10 + 1;
        bVar8 = bVar8 + 0x20;
      } while ((ulong)(local_f0[0].param_a.values.
                       super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                       .elem_count != 1) + 1 != lVar10);
    }
    local_f0[0].param_a.values.
    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
    _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
    local_128 = number_of_trials;
    if (uVar9 != 0) {
      operator_delete(local_f0[0].param_a.values.
                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                      .elems,uVar9 << 2);
    }
    if (uVar14 == 0) {
      bVar15 = false;
      bVar12 = 0;
    }
    else {
      lVar10 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar9 = uVar14 >> ((byte)lVar10 & 0x3f);
      while( true ) {
        uVar14 = uVar11;
        if (uVar9 < uVar11) {
          uVar14 = uVar9;
        }
        if (uVar9 == uVar11) break;
        if (uVar11 < uVar9) {
          uVar11 = uVar9;
        }
        uVar11 = uVar11 - uVar14;
        lVar10 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar11 = uVar11 >> ((byte)lVar10 & 0x3f);
        uVar9 = uVar14;
      }
      bVar15 = uVar14 == 1;
      bVar12 = bVar12 & bVar15;
    }
    if (bVar15) {
      uVar11 = 0x6329899ea9f2714b;
      local_140.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array = (_func_int **)0x6329899ea9f2714b;
      operator%(&local_f0[0].param_a,
                (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_170,
                (unsigned_long *)&local_140);
      uVar9 = (ulong)local_f0[0].param_a.values.
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elem_count;
      if (uVar9 == 0) {
        uVar14 = 0;
      }
      else {
        bVar8 = 0;
        lVar10 = 0;
        uVar14 = 0;
        do {
          in_R8 = (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                  ((ulong)local_f0[0].param_a.values.
                          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          .elems[lVar10] << (bVar8 & 0x3f));
          uVar14 = uVar14 | (ulong)in_R8;
          lVar10 = lVar10 + 1;
          bVar8 = bVar8 + 0x20;
        } while ((ulong)(local_f0[0].param_a.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elem_count != 1) + 1 != lVar10);
      }
      local_f0[0].param_a.values.
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
      _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
      if (uVar9 != 0) {
        operator_delete(local_f0[0].param_a.values.
                        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                        .elems,uVar9 << 2);
      }
      if (uVar14 == 0) {
        bVar15 = false;
        bVar12 = 0;
      }
      else {
        lVar10 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar9 = uVar14 >> ((byte)lVar10 & 0x3f);
        while( true ) {
          uVar14 = uVar11;
          if (uVar9 < uVar11) {
            uVar14 = uVar9;
          }
          if (uVar9 == uVar11) break;
          if (uVar11 < uVar9) {
            uVar11 = uVar9;
          }
          uVar11 = uVar11 - uVar14;
          lVar10 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar11 = uVar11 >> ((byte)lVar10 & 0x3f);
          uVar9 = uVar14;
        }
        bVar15 = uVar14 == 1;
        bVar12 = bVar12 & bVar15;
      }
      if (bVar15) {
        uVar11 = 0x58edcb4c9ed39c8b;
        local_140.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        _vptr_dynamic_array = (_func_int **)0x58edcb4c9ed39c8b;
        operator%(&local_f0[0].param_a,
                  (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&local_170
                  ,(unsigned_long *)&local_140);
        uVar9 = (ulong)local_f0[0].param_a.values.
                       super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                       .elem_count;
        if (uVar9 == 0) {
          uVar14 = 0;
        }
        else {
          bVar8 = 0;
          lVar10 = 0;
          uVar14 = 0;
          do {
            in_R8 = (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                    ((ulong)local_f0[0].param_a.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            .elems[lVar10] << (bVar8 & 0x3f));
            uVar14 = uVar14 | (ulong)in_R8;
            lVar10 = lVar10 + 1;
            bVar8 = bVar8 + 0x20;
          } while ((ulong)(local_f0[0].param_a.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elem_count != 1) + 1 != lVar10);
        }
        local_f0[0].param_a.values.
        super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
        _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
        if (uVar9 != 0) {
          operator_delete(local_f0[0].param_a.values.
                          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                          .elems,uVar9 << 2);
        }
        if (uVar14 == 0) {
          bVar15 = false;
          bVar12 = 0;
        }
        else {
          lVar10 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          uVar9 = uVar14 >> ((byte)lVar10 & 0x3f);
          while( true ) {
            uVar14 = uVar11;
            if (uVar9 < uVar11) {
              uVar14 = uVar9;
            }
            if (uVar9 == uVar11) break;
            if (uVar11 < uVar9) {
              uVar11 = uVar9;
            }
            uVar11 = uVar11 - uVar14;
            lVar10 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar11 = uVar11 >> ((byte)lVar10 & 0x3f);
            uVar9 = uVar14;
          }
          bVar15 = uVar14 == 1;
          bVar12 = bVar12 & bVar15;
        }
        if (bVar15) {
          uVar11 = 0x9966ff94fd516fb;
          local_140.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          _vptr_dynamic_array = (_func_int **)0x9966ff94fd516fb;
          operator%(&local_f0[0].param_a,
                    (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                    &local_170,(unsigned_long *)&local_140);
          uVar9 = (ulong)local_f0[0].param_a.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elem_count;
          if (uVar9 == 0) {
            uVar14 = 0;
          }
          else {
            bVar8 = 0;
            lVar10 = 0;
            uVar14 = 0;
            do {
              in_R8 = (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                      ((ulong)local_f0[0].param_a.values.
                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              .elems[lVar10] << (bVar8 & 0x3f));
              uVar14 = uVar14 | (ulong)in_R8;
              lVar10 = lVar10 + 1;
              bVar8 = bVar8 + 0x20;
            } while ((ulong)(local_f0[0].param_a.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elem_count != 1) + 1 != lVar10);
          }
          local_f0[0].param_a.values.
          super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
          _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
          if (uVar9 != 0) {
            operator_delete(local_f0[0].param_a.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            .elems,uVar9 << 2);
          }
          if (uVar14 == 0) {
            bVar15 = false;
            bVar12 = 0;
          }
          else {
            lVar10 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar9 = uVar14 >> ((byte)lVar10 & 0x3f);
            while( true ) {
              uVar14 = uVar11;
              if (uVar9 < uVar11) {
                uVar14 = uVar9;
              }
              if (uVar9 == uVar11) break;
              if (uVar11 < uVar9) {
                uVar11 = uVar9;
              }
              uVar11 = uVar11 - uVar14;
              lVar10 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar11 = uVar11 >> ((byte)lVar10 & 0x3f);
              uVar9 = uVar14;
            }
            bVar15 = uVar14 == 1;
            bVar12 = bVar12 & bVar15;
          }
          if (bVar15) {
            uVar11 = 0x49801d135ff5;
            local_140.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            _vptr_dynamic_array = (_func_int **)0x49801d135ff5;
            operator%(&local_f0[0].param_a,
                      (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                      &local_170,(unsigned_long *)&local_140);
            uVar9 = (ulong)local_f0[0].param_a.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elem_count;
            if (uVar9 == 0) {
              uVar14 = 0;
            }
            else {
              bVar8 = 0;
              lVar10 = 0;
              uVar14 = 0;
              do {
                in_R8 = (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                        ((ulong)local_f0[0].param_a.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems[lVar10] << (bVar8 & 0x3f));
                uVar14 = uVar14 | (ulong)in_R8;
                lVar10 = lVar10 + 1;
                bVar8 = bVar8 + 0x20;
              } while ((ulong)(local_f0[0].param_a.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elem_count != 1) + 1 != lVar10);
            }
            local_f0[0].param_a.values.
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
            if (uVar9 != 0) {
              operator_delete(local_f0[0].param_a.values.
                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              .elems,uVar9 << 2);
            }
            if (uVar14 == 0) {
              bVar15 = false;
              bVar12 = 0;
            }
            else {
              lVar10 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar9 = uVar14 >> ((byte)lVar10 & 0x3f);
              while( true ) {
                uVar14 = uVar11;
                if (uVar9 < uVar11) {
                  uVar14 = uVar9;
                }
                if (uVar9 == uVar11) break;
                if (uVar11 < uVar9) {
                  uVar11 = uVar9;
                }
                uVar11 = uVar11 - uVar14;
                lVar10 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                uVar11 = uVar11 >> ((byte)lVar10 & 0x3f);
                uVar9 = uVar14;
              }
              bVar15 = uVar14 == 1;
              bVar12 = bVar12 & bVar15;
            }
            if (bVar15) {
              local_f0[0].param_a.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array =
                   (_func_int **)
                   CONCAT44(local_f0[0].param_a.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            ._vptr_dynamic_array._4_4_,1);
              operator-(&local_140,
                        (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                        &local_170,(uint *)local_f0);
              local_188.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
              local_188.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elem_count = 0x40;
              local_188.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elems = (pointer)0x0;
              pvVar6 = (pointer)operator_new(0x100);
              local_188.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elems = pvVar6;
              if ((ulong)local_188.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elem_count != 0) {
                memset(pvVar6,0,(ulong)local_188.values.
                                       super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                       .elem_count << 2);
              }
              local_188.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00211c38;
              memset(pvVar6,0,0x100);
              *pvVar6 = 0xe4;
              powm<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
                        (&local_f0[0].param_a,(wide_integer *)&local_188,&local_140,
                         (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                         &local_170,in_R8);
              local_188.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
              if ((ulong)local_188.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elem_count != 0) {
                operator_delete(local_188.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems,(ulong)local_188.values.
                                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                              .elem_count << 2);
              }
              if (*local_f0[0].param_a.values.
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elems == 1) {
                local_188.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array =
                     (_func_int **)
                     CONCAT44(local_188.values.
                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                              ._vptr_dynamic_array._4_4_,1);
                eVar5 = operator==(&local_f0[0].param_a,(uint *)&local_188);
              }
              else {
                eVar5 = false;
              }
              local_f0[0].param_a.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
              if ((ulong)local_f0[0].param_a.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elem_count != 0) {
                operator_delete(local_f0[0].param_a.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems,(ulong)local_f0[0].param_a.values.
                                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                              .elem_count << 2);
              }
              if (eVar5 != false) {
                uVar7 = lsb<2048u,unsigned_int,std::allocator<unsigned_int>,false>(&local_140);
                operator>>(&local_188,&local_140,(uint)uVar7);
                local_1a0.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                local_1a0.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elem_count = 0x40;
                local_1a0.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elems = (pointer)0x0;
                pvVar6 = (pointer)operator_new(0x100);
                local_1a0.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                elems = pvVar6;
                if ((ulong)local_1a0.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elem_count != 0) {
                  memset(pvVar6,0,(ulong)local_1a0.values.
                                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                         .elem_count << 2);
                }
                local_1a0.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00211c38;
                memset(pvVar6,0,0x100);
                *pvVar6 = 2;
                local_158 = (undefined **)CONCAT44(local_158._4_4_,2);
                operator-(&local_1b8,
                          (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                          &local_170,(uint *)&local_158);
                uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                param_type::param_type(local_f0,&local_1a0,&local_1b8);
                local_1b8.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                if ((ulong)local_1b8.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elem_count != 0) {
                  operator_delete(local_1b8.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elems,(ulong)local_1b8.values.
                                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                .elem_count << 2);
                }
                local_1a0.values.
                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                if ((ulong)local_1a0.values.
                           super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                           .elem_count != 0) {
                  operator_delete(local_1a0.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elems,(ulong)local_1a0.values.
                                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                .elem_count << 2);
                }
                local_120 = distribution;
                local_118 = generator;
                uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                uintwide_t<2048U,_false,_nullptr>
                          ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           &local_1a0,
                           (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           &local_170);
                uVar11 = 0;
                bVar15 = true;
LAB_001bc18e:
                uniform_int_distribution<2048u,unsigned_int,std::allocator<unsigned_int>,false>::
                generate<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,64>
                          ((result_type *)&local_158,local_120,local_118,local_f0);
                powm<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,2048u,unsigned_int,std::allocator<unsigned_int>,false>
                          (&local_1b8,(wide_integer *)&local_158,&local_188,
                           (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                           &local_170,in_R8);
                local_158 = &PTR__dynamic_array_0020f6f8;
                local_110 = uVar11;
                if ((ulong)local_150 != 0) {
                  operator_delete(local_148,(ulong)local_150 << 2);
                }
                uVar11 = 0;
                do {
LAB_001bc1f6:
                  lVar10 = 0xfc;
                  do {
                    bVar12 = 0;
                    if (lVar10 == -4) break;
                    puVar1 = (uint *)((long)local_1b8.values.
                                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                            .elems + lVar10);
                    uVar13 = *(uint *)((long)local_140.values.
                                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                             .elems + lVar10);
                    in_R8 = (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                            (ulong)uVar13;
                    bVar12 = -(*puVar1 <= uVar13) | 1;
                    lVar10 = lVar10 + -4;
                  } while (*puVar1 == uVar13);
                  if (bVar12 == 0) {
LAB_001bc32e:
                    if (*local_1b8.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elems == 1) {
                      local_158 = (undefined **)CONCAT44(local_158._4_4_,1);
                      eVar5 = operator==(&local_1b8,(uint *)&local_158);
                    }
                    else {
                      eVar5 = false;
                    }
                    uVar3 = local_128;
                    bVar12 = bVar15;
                    if (eVar5 != false) {
                      bVar12 = false;
                    }
                    if (uVar11 == 0) {
                      bVar12 = bVar15;
                    }
                    local_1b8.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    ._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                    if ((ulong)local_1b8.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elem_count != 0) {
                      operator_delete(local_1b8.values.
                                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                      .elems,(ulong)local_1b8.values.
                                                                                                        
                                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                  .elem_count << 2);
                    }
                    uVar11 = local_110 + 1;
                    if ((uVar11 < uVar3) && (bVar15 = (bool)bVar12, (bool)bVar12 != false))
                    goto LAB_001bc18e;
                    local_1a0.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    ._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                    if ((ulong)local_1a0.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elem_count != 0) {
                      operator_delete(local_1a0.values.
                                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                      .elems,(ulong)local_1a0.values.
                                                                                                        
                                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                  .elem_count << 2);
                    }
                    uniform_int_distribution<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                    ::param_type::~param_type(local_f0);
                    local_188.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    ._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                    if ((ulong)local_188.values.
                               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elem_count != 0) {
                      operator_delete(local_188.values.
                                      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                      .elems,(ulong)local_188.values.
                                                                                                        
                                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                                  .elem_count << 2);
                    }
                    goto LAB_001bc40b;
                  }
                  if (*local_1b8.values.
                       super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                       .elems == 1) {
                    local_158 = (undefined **)CONCAT44(local_158._4_4_,1);
                    eVar5 = operator==(&local_1b8,(uint *)&local_158);
                    if (eVar5 || (bool)(~bVar15 & 1)) goto LAB_001bc32e;
                  }
                  else if (!bVar15) goto LAB_001bc32e;
                  uVar11 = uVar11 + 1;
                  if (uVar11 != (uVar7 & 0xffffffff)) {
                    uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                    uintwide_t<2048U,_false,_nullptr>
                              ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_158,&local_1b8);
                    uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator*=
                              ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_158,
                               (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_158);
                    uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator%=
                              ((uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_158,
                               (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_1a0);
                    uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
                    uintwide_t<4096U,_false,_nullptr>
                              (&local_108,
                               (uintwide_t<4096U,_unsigned_int,_std::allocator<unsigned_int>,_false>
                                *)&local_158);
                    pvVar6 = local_1b8.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems;
                    sVar2 = local_1b8.values.
                            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                            .elem_count;
                    uVar9 = (ulong)local_1b8.values.
                                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                   .elem_count;
                    local_1b8.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elem_count = local_108.values.
                                  super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                  .elem_count;
                    local_108.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elem_count = sVar2;
                    local_1b8.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems = local_108.values.
                             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                             .elems;
                    local_108.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    .elems = pvVar6;
                    local_108.values.
                    super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                    ._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
                    if (uVar9 != 0) {
                      operator_delete(pvVar6,uVar9 << 2);
                    }
                    local_158 = &PTR__dynamic_array_0020f6f8;
                    if ((ulong)local_150 != 0) {
                      operator_delete(local_148,(ulong)local_150 << 2);
                    }
                    goto LAB_001bc1f6;
                  }
                  bVar15 = false;
                } while( true );
              }
              bVar12 = false;
LAB_001bc40b:
              local_140.values.
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              _vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
              if ((ulong)local_140.values.
                         super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         .elem_count != 0) {
                operator_delete(local_140.values.
                                super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                .elems,(ulong)local_140.values.
                                              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                              .elem_count << 2);
              }
            }
          }
        }
      }
    }
  }
  local_170._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_0020f6f8;
  if ((ulong)local_170.elem_count != 0) {
    operator_delete(local_170.elems,(ulong)local_170.elem_count << 2);
  }
  return (bool)(bVar12 & 1);
}

Assistant:

auto miller_rabin(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& n, // NOLINT(readability-function-cognitive-complexity)
                    const unsigned_fast_type                                     number_of_trials,
                          DistributionType&                                      distribution,
                          GeneratorType&                                         generator) -> bool
  {
    // This Miller-Rabin primality test is loosely based on
    // an adaptation of some code from Boost.Multiprecision.
    // The Boost.Multiprecision code can be found here:
    // https://www.boost.org/doc/libs/1_87_0/libs/multiprecision/doc/html/boost_multiprecision/tut/primetest.html

    // Note: Some comments in this subroutine use the Wolfram Language(TM).
    // These can be exercised at the web links to WolframAlpha(R) provided

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_limb_type         = typename local_wide_integer_type::limb_type;

    const local_wide_integer_type np((!local_wide_integer_type::is_neg(n)) ? n : -n);

    {
      const auto n0 = static_cast<local_limb_type>(np);

      const auto n_is_even =
        (static_cast<local_limb_type>(n0 & static_cast<local_limb_type>(UINT8_C(1))) == static_cast<local_limb_type>(UINT8_C(0)));

      if(n_is_even)
      {
        // The prime candidate is not prime because n is even.
        // Also handle the trivial special case of (n = 2).

        const auto n_is_two =
          ((n0 == static_cast<local_limb_type>(UINT8_C(2))) && (np == static_cast<local_limb_type>(UINT8_C(2))));

        return n_is_two;
      }

      if((n0 <= static_cast<local_limb_type>(UINT8_C(227))) && (np <= static_cast<local_limb_type>(UINT8_C(227))))
      {
        // This handles the trivial special case of the (non-primality) of 1.
        const auto n_is_one =
          ((n0 == static_cast<local_limb_type>(UINT8_C(1))) && (np == static_cast<local_limb_type>(UINT8_C(1))));

        if(n_is_one)
        {
          return false;
        }

        // Exclude pure small primes from 3...227.
        // Table[Prime[i], {i, 2, 49}] =
        // {
        //     3,   5,   7,  11,  13,  17,  19,  23,
        //    29,  31,  37,  41,  43,  47,  53,  59,
        //    61,  67,  71,  73,  79,  83,  89,  97,
        //   101, 103, 107, 109, 113, 127, 131, 137,
        //   139, 149, 151, 157, 163, 167, 173, 179,
        //   181, 191, 193, 197, 199, 211, 223, 227
        // }
        // See also:
        // https://www.wolframalpha.com/input/?i=Table%5BPrime%5Bi%5D%2C+%7Bi%2C+2%2C+49%7D%5D

        constexpr detail::array_detail::array<local_limb_type, static_cast<std::size_t>(UINT8_C(48))> small_primes =
        {
          static_cast<local_limb_type>(UINT8_C(  3)), static_cast<local_limb_type>(UINT8_C(  5)), static_cast<local_limb_type>(UINT8_C(  7)), static_cast<local_limb_type>(UINT8_C( 11)), static_cast<local_limb_type>(UINT8_C( 13)), static_cast<local_limb_type>(UINT8_C( 17)), static_cast<local_limb_type>(UINT8_C( 19)), static_cast<local_limb_type>(UINT8_C( 23)),
          static_cast<local_limb_type>(UINT8_C( 29)), static_cast<local_limb_type>(UINT8_C( 31)), static_cast<local_limb_type>(UINT8_C( 37)), static_cast<local_limb_type>(UINT8_C( 41)), static_cast<local_limb_type>(UINT8_C( 43)), static_cast<local_limb_type>(UINT8_C( 47)), static_cast<local_limb_type>(UINT8_C( 53)), static_cast<local_limb_type>(UINT8_C( 59)),
          static_cast<local_limb_type>(UINT8_C( 61)), static_cast<local_limb_type>(UINT8_C( 67)), static_cast<local_limb_type>(UINT8_C( 71)), static_cast<local_limb_type>(UINT8_C( 73)), static_cast<local_limb_type>(UINT8_C( 79)), static_cast<local_limb_type>(UINT8_C( 83)), static_cast<local_limb_type>(UINT8_C( 89)), static_cast<local_limb_type>(UINT8_C( 97)),
          static_cast<local_limb_type>(UINT8_C(101)), static_cast<local_limb_type>(UINT8_C(103)), static_cast<local_limb_type>(UINT8_C(107)), static_cast<local_limb_type>(UINT8_C(109)), static_cast<local_limb_type>(UINT8_C(113)), static_cast<local_limb_type>(UINT8_C(127)), static_cast<local_limb_type>(UINT8_C(131)), static_cast<local_limb_type>(UINT8_C(137)),
          static_cast<local_limb_type>(UINT8_C(139)), static_cast<local_limb_type>(UINT8_C(149)), static_cast<local_limb_type>(UINT8_C(151)), static_cast<local_limb_type>(UINT8_C(157)), static_cast<local_limb_type>(UINT8_C(163)), static_cast<local_limb_type>(UINT8_C(167)), static_cast<local_limb_type>(UINT8_C(173)), static_cast<local_limb_type>(UINT8_C(179)),
          static_cast<local_limb_type>(UINT8_C(181)), static_cast<local_limb_type>(UINT8_C(191)), static_cast<local_limb_type>(UINT8_C(193)), static_cast<local_limb_type>(UINT8_C(197)), static_cast<local_limb_type>(UINT8_C(199)), static_cast<local_limb_type>(UINT8_C(211)), static_cast<local_limb_type>(UINT8_C(223)), static_cast<local_limb_type>(UINT8_C(227))
        };

        return detail::binary_search_unsafe(small_primes.cbegin(), small_primes.cend(), n0);
      }
    }

    // Check small factors.

    // Exclude small prime factors from { 3 ...  53 }.
    // Product[Prime[i], {i, 2, 16}] = 16294579238595022365
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+2%2C+16%7D%5D
    {
      constexpr std::uint64_t pp0 = UINT64_C(16294579238595022365);

      const auto m0 = static_cast<std::uint64_t>(np % pp0);

      if((m0 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m0, pp0) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 59 ... 101 }.
    // Product[Prime[i], {i, 17, 26}] = 7145393598349078859
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+17%2C+26%7D%5D
    {
      constexpr std::uint64_t pp1 = UINT64_C(7145393598349078859);

      const auto m1 = static_cast<std::uint64_t>(np % pp1);

      if((m1 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m1, pp1) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 103 ... 149 }.
    // Product[Prime[i], {i, 27, 35}] = 6408001374760705163
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+27%2C+35%7D%5D
    {
      constexpr std::uint64_t pp2 = UINT64_C(6408001374760705163);

      const auto m2 = static_cast<std::uint64_t>(np % pp2);

      if((m2 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m2, pp2) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 151 ... 191 }.
    // Product[Prime[i], {i, 36, 43}] = 690862709424854779
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+36%2C+43%7D%5D
    {
      constexpr std::uint64_t pp3 = UINT64_C(690862709424854779);

      const auto m3 = static_cast<std::uint64_t>(np % pp3);

      if((m3 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m3, pp3) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    // Exclude small prime factors from { 193 ... 227 }.
    // Product[Prime[i], {i, 44, 49}] = 80814592450549
    // See also: https://www.wolframalpha.com/input/?i=Product%5BPrime%5Bi%5D%2C+%7Bi%2C+44%2C+49%7D%5D
    {
      constexpr std::uint64_t pp4 = UINT64_C(80814592450549);

      const auto m4 = static_cast<std::uint64_t>(np % pp4);

      if((m4 == static_cast<std::uint64_t>(UINT8_C(0))) || (detail::integer_gcd_reduce(m4, pp4) != static_cast<std::uint64_t>(UINT8_C(1))))
      {
        return false;
      }
    }

    const local_wide_integer_type nm1 { np - static_cast<unsigned>(UINT8_C(1)) };

    auto
      local_functor_isone
      {
        [](const local_wide_integer_type& t1)
        {
          return
          (
               (static_cast<local_limb_type>(t1) == local_limb_type { UINT8_C(1) })
            && (t1 == unsigned { UINT8_C(1) })
          );
        }
      };

    // Since we have already excluded all small factors
    // up to and including 227, n is greater than 227.

    {
      // Perform a single Fermat test which will
      // exclude many non-prime candidates.

      const local_wide_integer_type fn { powm(local_wide_integer_type(static_cast<local_limb_type>(228U)), nm1, np) };

      if(!local_functor_isone(fn))
      {
        return false;
      }
    }

    const unsigned k { static_cast<unsigned>(lsb(nm1)) };

    const local_wide_integer_type q { nm1 >> k };

    using local_param_type = typename DistributionType::param_type;

    const local_param_type
      params
      {
        local_wide_integer_type { unsigned { UINT8_C(2) } },
        np - unsigned { UINT8_C(2) }
      };

    // Assume the test will pass, even though it usually does not pass.
    bool result_candidate_is_prime { true };

    ::std::size_t idx { UINT8_C(0) };

    using local_double_width_type = typename local_wide_integer_type::double_width_type;

    const local_double_width_type np_dbl { np };

    // Loop over the trials to perform the primality testing.
    do
    {
      local_wide_integer_type y { powm(distribution(generator, params), q, np) };

      ::std::size_t jdx { UINT8_C(0) };

      // Continue while y is not nm1, and while y is not 1,
      // and while the result is true.

      while((y != nm1) && (!local_functor_isone(y)) && result_candidate_is_prime) // NOLINT(altera-id-dependent-backward-branch)
      {
        ++jdx;

        if(jdx == static_cast<std::size_t>(k))
        {
          // Mark failure if max iterations reached.
          result_candidate_is_prime = false;
        }
        else
        {
          // Continue with the next value of y.

          // Manually calculate: y = powm(y, 2, np);

          local_double_width_type yd { y };

          yd *= yd;
          yd %= np_dbl;

          y = local_wide_integer_type { yd };
        }
      }

      // Check for (y == 1) after the loop.
      if(local_functor_isone(y) && (jdx != ::std::size_t { UINT8_C(0) }))
      {
        // Mark failure if (y == 1) and (jdx != 0).
        result_candidate_is_prime = false;
      }

      ++idx;
    }
    while((idx < number_of_trials) && result_candidate_is_prime);

    return result_candidate_is_prime;
  }